

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O3

int CountQCost(void)

{
  int iVar1;
  Cube *p;
  int iVar2;
  
  iVar2 = 0;
  p = IterCubeSetStart();
  if (p != (Cube *)0x0) {
    iVar2 = 0;
    do {
      iVar1 = ComputeQCostBits(p);
      iVar2 = iVar2 + iVar1;
      p = IterCubeSetNext();
    } while (p != (Cube *)0x0);
  }
  return iVar2;
}

Assistant:

int CountQCost()
{
    Cube* p;
    int QCost = 0;
    int QCostControl = 0;
    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        QCostControl += p->q;
        QCost += ComputeQCostBits( p );
    }
//    if ( QCostControl != QCost )
//        printf( "Warning! The recorded number of literals (%d) differs from the actual number (%d)\n", QCostControl, QCost );
    return QCost;
}